

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_ttf_font_info *
rf_parse_ttf_font(rf_ttf_font_info *__return_storage_ptr__,void *ttf_data,rf_int font_size)

{
  byte bVar1;
  byte bVar2;
  stbtt__buf fontdict;
  undefined1 auVar3 [16];
  stbtt_uint32 sVar4;
  undefined8 uVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  stbtt_uint32 sVar11;
  stbtt_uint32 sVar12;
  stbtt_uint32 sVar13;
  stbtt_uint32 sVar14;
  uint uVar15;
  ushort uVar16;
  stbtt_uint32 sVar17;
  int iVar18;
  uint uVar19;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *tag_06;
  undefined8 extraout_RDX;
  char *tag_07;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uchar *puVar24;
  long in_FS_OFFSET;
  stbtt__buf sVar25;
  anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect aVar26;
  anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect aVar27;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  stbtt_uint32 charstrings;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  stbtt_uint32 local_f4;
  stbtt_uint32 sVar28;
  stbtt_uint32 sVar29;
  undefined8 in_stack_ffffffffffffff18;
  uchar *puVar30;
  uchar *local_d0;
  stbtt_uint32 local_a4;
  undefined8 local_a0;
  uchar *local_98;
  undefined8 local_90;
  uchar *local_88;
  undefined8 local_80;
  uchar *local_78;
  rf_int local_70;
  stbtt__buf local_68;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  stbtt__buf local_40;
  
  memset(__return_storage_ptr__,0,200);
  if (font_size < 1 || ttf_data == (void *)0x0) {
    return __return_storage_ptr__;
  }
  local_70 = font_size;
  sVar6 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17be90,tag);
  sVar7 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d140,tag_00);
  sVar8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d145,tag_01);
  sVar9 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d14a,tag_02);
  sVar10 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d14f,tag_03);
  sVar11 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d154,tag_04);
  sVar12 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d159,tag_05);
  sVar13 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d15e,tag_06);
  tag_07 = (char *)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                            (sVar11 == 0 || sVar10 == 0) || (sVar8 == 0 || sVar6 == 0));
  if ((sVar11 == 0 || sVar10 == 0) || (sVar8 == 0 || sVar6 == 0)) goto LAB_0013293c;
  if (sVar9 == 0) {
    sVar29 = 2;
    local_a4 = 0;
    sVar28 = 0;
    local_f4 = 0;
    sVar14 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d163,tag_07);
    if (sVar14 == 0) goto LAB_0013293c;
    local_78 = (uchar *)((long)ttf_data + (ulong)sVar14);
    local_80 = 0x2000000000000000;
    local_68.size = 0x20000000;
    local_68.cursor = (uint)*(byte *)((long)ttf_data + (ulong)sVar14 + 2);
    local_68.data = local_78;
    stbtt__cff_get_index(&local_68);
    sVar25 = stbtt__cff_get_index(&local_68);
    local_40 = stbtt__cff_index_get(sVar25,0);
    stbtt__cff_get_index(&local_68);
    sVar25 = stbtt__cff_get_index(&local_68);
    local_90 = sVar25._8_8_;
    local_88 = sVar25.data;
    stbtt__dict_get_ints(&local_40,0x11,1,&local_a4);
    stbtt__dict_get_ints(&local_40,0x106,1,(stbtt_uint32 *)&stack0xffffffffffffff14);
    stbtt__dict_get_ints(&local_40,0x124,1,(stbtt_uint32 *)&stack0xffffffffffffff10);
    stbtt__dict_get_ints(&local_40,0x125,1,&local_f4);
    uVar5 = local_68._8_8_;
    sVar25.data._4_4_ = in_stack_fffffffffffffeec;
    sVar25.data._0_4_ = in_stack_fffffffffffffee8;
    sVar25.cursor = in_stack_fffffffffffffef0;
    sVar25.size = in_stack_fffffffffffffef4;
    fontdict.data._4_4_ = sVar29;
    fontdict.data._0_4_ = sVar28;
    fontdict.cursor = (int)in_stack_ffffffffffffff18;
    fontdict.size = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    aVar26 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             stbtt__get_subrs(sVar25,fontdict);
    sVar4 = local_a4;
    sVar14 = local_f4;
    if (local_a4 == 0 || sVar29 != 2) goto LAB_0013293c;
    sVar29 = SUB84(uVar5,4);
    if (sVar28 == 0) {
      aVar27 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
               ZEXT816(0);
      local_d0 = (uchar *)0x0;
      puVar30 = (uchar *)0x0;
    }
    else {
      uVar21 = (ulong)local_f4;
      if (uVar21 == 0) goto LAB_0013293c;
      sVar17 = sVar28;
      if ((int)sVar29 < (int)sVar28) {
        sVar17 = sVar29;
      }
      if ((int)sVar28 < 0) {
        sVar17 = sVar29;
      }
      local_68.cursor = sVar17;
      aVar27 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
               stbtt__cff_get_index(&local_68);
      sVar29 = local_68.size;
      puVar30 = (uchar *)((ulong)(local_68.size - sVar14) << 0x20);
      local_d0 = local_68.data + uVar21;
      if ((int)(local_68.size - sVar14 | sVar14) < 0 || local_68.size < (int)sVar14) {
        puVar30 = (uchar *)0x0;
        local_d0 = (uchar *)0x0;
      }
    }
    sVar14 = sVar4;
    if ((int)sVar29 < (int)sVar4) {
      sVar14 = sVar29;
    }
    if ((int)sVar4 < 0) {
      sVar14 = sVar29;
    }
    local_68.cursor = sVar14;
    sVar25 = stbtt__cff_get_index(&local_68);
    local_a0 = sVar25._8_8_;
    puVar24 = local_78;
  }
  else {
    local_80 = 0;
    local_98 = (uchar *)0x0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = tag_07;
    sVar25 = (stbtt__buf)(auVar3 << 0x40);
    local_a0 = 0;
    local_88 = (uchar *)0x0;
    local_90 = 0;
    aVar26 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             ZEXT816(0);
    aVar27 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             ZEXT816(0);
    local_d0 = (uchar *)0x0;
    puVar30 = (uchar *)0x0;
    puVar24 = (uchar *)0x0;
    if (sVar7 == 0) goto LAB_0013293c;
  }
  local_98 = sVar25.data;
  sVar14 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17d168,sVar25._8_8_);
  if (sVar14 == 0) {
    uVar15 = 0xffff;
  }
  else {
    uVar16 = *(ushort *)((long)ttf_data + (ulong)sVar14 + 4);
    uVar15 = (uint)(ushort)(uVar16 << 8 | uVar16 >> 8);
  }
  uVar16 = *(ushort *)((long)ttf_data + (ulong)sVar6 + 2);
  uVar16 = uVar16 << 8 | uVar16 >> 8;
  if (uVar16 != 0) {
    uVar19 = sVar6 + 4;
    uVar21 = (ulong)uVar16;
    iVar18 = 0;
    do {
      uVar20 = (ulong)uVar19;
      uVar16 = *(ushort *)((long)ttf_data + uVar20) << 8 | *(ushort *)((long)ttf_data + uVar20) >> 8
      ;
      if ((uVar16 == 0) ||
         ((uVar16 == 3 &&
          ((uVar16 = *(ushort *)((long)ttf_data + uVar20 + 2), uVar16 = uVar16 << 8 | uVar16 >> 8,
           uVar16 == 10 || (uVar16 == 1)))))) {
        uVar23 = *(uint *)((long)ttf_data + uVar20 + 4);
        iVar18 = (uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                 uVar23 << 0x18) + sVar6;
      }
      uVar19 = uVar19 + 8;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    if (iVar18 != 0) {
      lVar22 = (long)(int)sVar10;
      uVar19 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar22 + 4) << 8) |
               (uint)*(byte *)((long)ttf_data + lVar22 + 5);
      uVar23 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar22 + 6) << 8) |
               (uint)*(byte *)((long)ttf_data + lVar22 + 7);
      bVar1 = *(byte *)((long)ttf_data + lVar22 + 9);
      bVar2 = *(byte *)((long)ttf_data + lVar22 + 8);
      uVar16 = *(ushort *)((long)ttf_data + (long)(int)sVar8 + 0x32);
      *(undefined4 *)&__return_storage_ptr__->field_0xc4 = 0;
      *(undefined4 *)&__return_storage_ptr__->field_0xc1 = 0;
      __return_storage_ptr__->ttf_data = ttf_data;
      __return_storage_ptr__->font_size = (int)local_70;
      __return_storage_ptr__->largest_glyph_size = 0;
      __return_storage_ptr__->scale_factor = (float)local_70 / (float)(int)(uVar19 - uVar23);
      __return_storage_ptr__->ascent = uVar19;
      __return_storage_ptr__->descent = uVar23;
      __return_storage_ptr__->line_gap = (int)(short)((ushort)bVar2 << 8) | (uint)bVar1;
      __return_storage_ptr__->valid = true;
      (__return_storage_ptr__->internal_stb_font_info).userdata = (void *)0x0;
      (__return_storage_ptr__->internal_stb_font_info).data = (uchar *)ttf_data;
      (__return_storage_ptr__->internal_stb_font_info).fontstart = 0;
      (__return_storage_ptr__->internal_stb_font_info).numGlyphs = uVar15;
      (__return_storage_ptr__->internal_stb_font_info).loca = sVar7;
      (__return_storage_ptr__->internal_stb_font_info).head = sVar8;
      (__return_storage_ptr__->internal_stb_font_info).glyf = sVar9;
      (__return_storage_ptr__->internal_stb_font_info).hhea = sVar10;
      (__return_storage_ptr__->internal_stb_font_info).hmtx = sVar11;
      (__return_storage_ptr__->internal_stb_font_info).kern = sVar12;
      (__return_storage_ptr__->internal_stb_font_info).gpos = sVar13;
      (__return_storage_ptr__->internal_stb_font_info).svg = -1;
      (__return_storage_ptr__->internal_stb_font_info).index_map = iVar18;
      (__return_storage_ptr__->internal_stb_font_info).indexToLocFormat =
           (uint)(ushort)(uVar16 << 8 | uVar16 >> 8);
      (__return_storage_ptr__->internal_stb_font_info).cff.data = puVar24;
      (__return_storage_ptr__->internal_stb_font_info).cff.cursor = (undefined4)local_80;
      (__return_storage_ptr__->internal_stb_font_info).cff.size = local_80._4_4_;
      (__return_storage_ptr__->internal_stb_font_info).charstrings.data = local_98;
      (__return_storage_ptr__->internal_stb_font_info).charstrings.cursor = (undefined4)local_a0;
      (__return_storage_ptr__->internal_stb_font_info).charstrings.size = local_a0._4_4_;
      (__return_storage_ptr__->internal_stb_font_info).gsubrs.data = local_88;
      (__return_storage_ptr__->internal_stb_font_info).gsubrs.cursor = (undefined4)local_90;
      (__return_storage_ptr__->internal_stb_font_info).gsubrs.size = local_90._4_4_;
      (__return_storage_ptr__->internal_stb_font_info).subrs = aVar26;
      (__return_storage_ptr__->internal_stb_font_info).fontdicts = aVar27;
      (__return_storage_ptr__->internal_stb_font_info).fdselect.data = local_d0;
      *(uchar **)&(__return_storage_ptr__->internal_stb_font_info).fdselect.cursor = puVar30;
      return __return_storage_ptr__;
    }
  }
LAB_0013293c:
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_50 = "rf_parse_ttf_font";
  local_48 = 0x5b6e;
  rf_log_impl(8,0x17b8ff,(char *)0x8);
  *(char **)(in_FS_OFFSET + -0x450) =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  *(char **)(in_FS_OFFSET + -0x448) = "rf_parse_ttf_font";
  *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x5b6e;
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 8;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ttf_font_info rf_parse_ttf_font(const void* ttf_data, rf_int font_size)
{
    rf_ttf_font_info result = {0};

    if (ttf_data && font_size > 0)
    {
        stbtt_fontinfo font_info = {0};
        if (stbtt_InitFont(&font_info, ttf_data, 0))
        {
            // Calculate font scale factor
            float scale_factor = stbtt_ScaleForPixelHeight(&font_info, (float)font_size);

            // Calculate font basic metrics
            // NOTE: ascent is equivalent to font baseline
            int ascent, descent, line_gap;
            stbtt_GetFontVMetrics(&font_info, &ascent, &descent, &line_gap);

            result = (rf_ttf_font_info)
            {
                .ttf_data = ttf_data,
                .font_size = font_size,
                .scale_factor = scale_factor,
                .ascent = ascent,
                .descent = descent,
                .line_gap = line_gap,
                .valid = true,
            };

            RF_ASSERT(sizeof(stbtt_fontinfo) == sizeof(result.internal_stb_font_info));
            memcpy(&result.internal_stb_font_info, &font_info, sizeof(stbtt_fontinfo));
        }
        else RF_LOG_ERROR(RF_STBTT_FAILED, "STB failed to parse ttf font.");
    }

    return result;
}